

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_material.cpp
# Opt level: O1

uchar * __thiscall
FGLTexture::CreateTexBuffer
          (FGLTexture *this,int translation,int *w,int *h,FTexture *hirescheck,bool createexpanded,
          bool alphatrans)

{
  ushort uVar1;
  FTexture *this_00;
  byte bVar2;
  int trans;
  uchar *buffer;
  BYTE *__s;
  ulong uVar3;
  int iVar4;
  int srcheight;
  ulong __n;
  int srcwidth;
  FGLBitmap bmp;
  FBitmap imgCreate;
  
  if (((hirescheck == (FTexture *)0x0 || alphatrans) || !gl_texture_usehires.Value) ||
     (buffer = LoadHiresTexture(this,hirescheck,w,h), buffer == (uchar *)0x0)) {
    bVar2 = this->bExpandFlag & createexpanded;
    uVar3 = (ulong)bVar2;
    this_00 = this->tex;
    srcwidth = (uint)this_00->Width + (uint)bVar2 * 2;
    *w = srcwidth;
    uVar1 = this_00->Height;
    srcheight = (uint)uVar1 + (uint)bVar2 * 2;
    *h = srcheight;
    iVar4 = srcwidth * 4;
    __n = (ulong)(((uint)uVar1 + (uint)bVar2 * 2 + 1) * iVar4);
    buffer = (uchar *)operator_new__(__n);
    memset(buffer,0,__n);
    bmp.super_FBitmap.FreeBuffer = false;
    bmp.super_FBitmap.ClipRect.x = 0;
    bmp.super_FBitmap.ClipRect.y = 0;
    bmp.super_FBitmap._vptr_FBitmap = (_func_int **)&PTR__FBitmap_00842e50;
    bmp.translation = 0;
    if (translation != -0x539) {
      bmp.translation = translation;
    }
    bmp.alphatrans = alphatrans;
    bmp.super_FBitmap.data = buffer;
    bmp.super_FBitmap.Width = srcwidth;
    bmp.super_FBitmap.Height = srcheight;
    bmp.super_FBitmap.Pitch = iVar4;
    bmp.super_FBitmap.ClipRect.width = srcwidth;
    bmp.super_FBitmap.ClipRect.height = srcheight;
    if ((this_00->field_0x32 & 1) == 0) {
      if (translation < 1) {
        iVar4 = (*this_00->_vptr_FTexture[4])(this_00,&bmp,uVar3,uVar3,0,0);
        FTexture::CheckTrans(this->tex,buffer,srcheight * srcwidth,iVar4);
        this->bIsTransparent = (char)((this->tex->gl_info).field_0x4c << 6) >> 6;
      }
      else {
        FTexture::CopyTrueColorPixels
                  (this_00,&bmp.super_FBitmap,(uint)bVar2,(uint)bVar2,0,(FCopyInfo *)0x0);
        this->bIsTransparent = '\0';
      }
    }
    else {
      imgCreate._vptr_FBitmap = (_func_int **)&PTR__FBitmap_00865400;
      imgCreate.data = (BYTE *)0x0;
      imgCreate.FreeBuffer = false;
      imgCreate.ClipRect.x = 0;
      imgCreate.ClipRect.y = 0;
      imgCreate.ClipRect.width = 0;
      imgCreate.ClipRect.height = 0;
      imgCreate.Width = srcwidth;
      imgCreate.Height = srcheight;
      imgCreate.Pitch = iVar4;
      __s = (BYTE *)operator_new__((ulong)(uint)(srcheight * iVar4));
      imgCreate.data = __s;
      memset(__s,0,(ulong)(uint)(srcheight * iVar4));
      imgCreate.FreeBuffer = true;
      imgCreate.ClipRect.x = 0;
      imgCreate.ClipRect.y = 0;
      imgCreate.ClipRect.height = srcheight;
      imgCreate.ClipRect.width = srcwidth;
      memset(__s,0,(ulong)(uint)(srcheight * srcwidth * 4));
      trans = (*this_00->_vptr_FTexture[4])(this_00,&imgCreate,uVar3,uVar3,0,0);
      FGLBitmap::CopyPixelDataRGB
                (&bmp,0,0,imgCreate.data,srcwidth,srcheight,4,iVar4,0,6,(FCopyInfo *)0x0,0,0,0);
      FTexture::CheckTrans(this->tex,buffer,srcheight * srcwidth,trans);
      this->bIsTransparent = (char)((this->tex->gl_info).field_0x4c << 6) >> 6;
      imgCreate._vptr_FBitmap = (_func_int **)&PTR__FBitmap_00865400;
      if ((imgCreate.data != (BYTE *)0x0) && (imgCreate.FreeBuffer == true)) {
        operator_delete__(imgCreate.data);
      }
    }
    if (createexpanded) {
      buffer = gl_CreateUpsampledTextureBuffer
                         (this->tex,buffer,srcwidth,srcheight,w,h,this->bIsTransparent != '\0');
    }
    bmp.super_FBitmap._vptr_FBitmap = (_func_int **)&PTR__FBitmap_00865400;
    if ((bmp.super_FBitmap.data != (BYTE *)0x0) && (bmp.super_FBitmap.FreeBuffer == true)) {
      operator_delete__(bmp.super_FBitmap.data);
    }
  }
  return buffer;
}

Assistant:

unsigned char * FGLTexture::CreateTexBuffer(int translation, int & w, int & h, FTexture *hirescheck, bool createexpanded, bool alphatrans)
{
	unsigned char * buffer;
	int W, H;


	// Textures that are already scaled in the texture lump will not get replaced
	// by hires textures
	if (gl_texture_usehires && hirescheck != NULL && !alphatrans)
	{
		buffer = LoadHiresTexture (hirescheck, &w, &h);
		if (buffer)
		{
			return buffer;
		}
	}

	int exx = bExpandFlag && createexpanded;

	W = w = tex->GetWidth() + 2 * exx;
	H = h = tex->GetHeight() + 2 * exx;


	buffer=new unsigned char[W*(H+1)*4];
	memset(buffer, 0, W * (H+1) * 4);

	FGLBitmap bmp(buffer, W*4, W, H);
	bmp.SetTranslationInfo(translation, alphatrans);

	if (tex->bComplex)
	{
		FBitmap imgCreate;

		// The texture contains special processing so it must be composited using the
		// base bitmap class and then be converted as a whole.
		if (imgCreate.Create(W, H))
		{
			memset(imgCreate.GetPixels(), 0, W * H * 4);
			int trans = tex->CopyTrueColorPixels(&imgCreate, exx, exx);
			bmp.CopyPixelDataRGB(0, 0, imgCreate.GetPixels(), W, H, 4, W * 4, 0, CF_BGRA);
			tex->CheckTrans(buffer, W*H, trans);
			bIsTransparent = tex->gl_info.mIsTransparent;
		}
	}
	else if (translation<=0)
	{
		int trans = tex->CopyTrueColorPixels(&bmp, exx, exx);
		tex->CheckTrans(buffer, W*H, trans);
		bIsTransparent = tex->gl_info.mIsTransparent;
	}
	else
	{
		// When using translations everything must be mapped to the base palette.
		// Since FTexture's method is doing exactly that by calling GetPixels let's use that here
		// to do all the dirty work for us. ;)
		tex->FTexture::CopyTrueColorPixels(&bmp, exx, exx);
		bIsTransparent = 0;
	}

	// if we just want the texture for some checks there's no need for upsampling.
	if (!createexpanded) return buffer;

	// [BB] The hqnx upsampling (not the scaleN one) destroys partial transparency, don't upsamle textures using it.
	// [BB] Potentially upsample the buffer.
	return gl_CreateUpsampledTextureBuffer ( tex, buffer, W, H, w, h, !!bIsTransparent);
}